

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int InitYUVRescaler(VP8Io *io,WebPDecParams *p)

{
  rescaler_t rVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int src_width;
  int src_height;
  int iVar5;
  uint8_t *dst;
  long lVar6;
  long lVar7;
  uint64_t size;
  void *pvVar8;
  ulong uVar9;
  long in_RSI;
  rescaler_t *in_RDI;
  int num_rescalers;
  WebPRescaler *scalers;
  rescaler_t *work;
  size_t rescaler_size;
  uint64_t total_size;
  size_t uv_work_size;
  size_t work_size;
  int uv_in_height;
  int uv_in_width;
  int uv_out_height;
  int uv_out_width;
  int out_height;
  int out_width;
  WebPYUVABuffer *buf;
  int has_alpha;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint64_t in_stack_ffffffffffffff78;
  long local_80;
  long local_58;
  int in_stack_ffffffffffffffe0;
  
  iVar2 = WebPIsAlphaMode(MODE_RGB);
  rVar1 = in_RDI[0x23];
  iVar3 = (int)(rVar1 + 1) >> 1;
  iVar4 = (int)(in_RDI[0x24] + 1) >> 1;
  src_width = (int)(in_RDI[3] + 1) >> 1;
  src_height = (int)(in_RDI[4] + 1) >> 1;
  dst = (uint8_t *)((long)(int)rVar1 * 2);
  lVar6 = (long)(iVar3 << 1);
  iVar5 = 3;
  if (iVar2 != 0) {
    iVar5 = 4;
  }
  local_58 = (long)(dst + lVar6 * 2) * 4;
  if (iVar2 != 0) {
    local_58 = (long)(int)rVar1 * 8 + local_58;
  }
  lVar7 = (long)iVar5 * 0x68 + 0x1f;
  size = lVar7 + local_58;
  iVar5 = CheckSizeOverflow(size);
  if (iVar5 != 0) {
    pvVar8 = WebPSafeMalloc(in_stack_ffffffffffffff78,
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    *(void **)(in_RSI + 0x50) = pvVar8;
    if (*(long *)(in_RSI + 0x50) != 0) {
      uVar9 = ((*(long *)(in_RSI + 0x50) + size) - lVar7) + 0x1f & 0xffffffffffffffe0;
      *(ulong *)(in_RSI + 0x30) = uVar9;
      *(ulong *)(in_RSI + 0x38) = uVar9 + 0x68;
      *(ulong *)(in_RSI + 0x40) = uVar9 + 0xd0;
      if (iVar2 == 0) {
        local_80 = 0;
      }
      else {
        local_80 = uVar9 + 0x138;
      }
      *(long *)(in_RSI + 0x48) = local_80;
      iVar5 = WebPRescalerInit((WebPRescaler *)CONCAT44(iVar3,iVar4),src_width,src_height,dst,
                               (int)((ulong)lVar6 >> 0x20),(int)lVar6,in_stack_ffffffffffffffe0,
                               (int)in_RSI,in_RDI);
      if (((iVar5 != 0) &&
          (iVar5 = WebPRescalerInit((WebPRescaler *)CONCAT44(iVar3,iVar4),src_width,src_height,dst,
                                    (int)((ulong)lVar6 >> 0x20),(int)lVar6,in_stack_ffffffffffffffe0
                                    ,(int)in_RSI,in_RDI), iVar5 != 0)) &&
         (iVar5 = WebPRescalerInit((WebPRescaler *)CONCAT44(iVar3,iVar4),src_width,src_height,dst,
                                   (int)((ulong)lVar6 >> 0x20),(int)lVar6,in_stack_ffffffffffffffe0,
                                   (int)in_RSI,in_RDI), iVar5 != 0)) {
        *(code **)(in_RSI + 0x58) = EmitRescaledYUV;
        if (iVar2 != 0) {
          iVar2 = WebPRescalerInit((WebPRescaler *)CONCAT44(iVar3,iVar4),src_width,src_height,dst,
                                   (int)((ulong)lVar6 >> 0x20),(int)lVar6,in_stack_ffffffffffffffe0,
                                   (int)in_RSI,in_RDI);
          if (iVar2 == 0) {
            return 0;
          }
          *(code **)(in_RSI + 0x60) = EmitRescaledAlphaYUV;
          WebPInitAlphaProcessing();
        }
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int InitYUVRescaler(const VP8Io* const io, WebPDecParams* const p) {
  const int has_alpha = WebPIsAlphaMode(p->output->colorspace);
  const WebPYUVABuffer* const buf = &p->output->u.YUVA;
  const int out_width  = io->scaled_width;
  const int out_height = io->scaled_height;
  const int uv_out_width  = (out_width + 1) >> 1;
  const int uv_out_height = (out_height + 1) >> 1;
  const int uv_in_width  = (io->mb_w + 1) >> 1;
  const int uv_in_height = (io->mb_h + 1) >> 1;
  // scratch memory for luma rescaler
  const size_t work_size = 2 * (size_t)out_width;
  const size_t uv_work_size = 2 * uv_out_width;  // and for each u/v ones
  uint64_t total_size;
  size_t rescaler_size;
  rescaler_t* work;
  WebPRescaler* scalers;
  const int num_rescalers = has_alpha ? 4 : 3;

  total_size = ((uint64_t)work_size + 2 * uv_work_size) * sizeof(*work);
  if (has_alpha) {
    total_size += (uint64_t)work_size * sizeof(*work);
  }
  rescaler_size = num_rescalers * sizeof(*p->scaler_y) + WEBP_ALIGN_CST;
  total_size += rescaler_size;
  if (!CheckSizeOverflow(total_size)) {
    return 0;
  }

  p->memory = WebPSafeMalloc(1ULL, (size_t)total_size);
  if (p->memory == NULL) {
    return 0;   // memory error
  }
  work = (rescaler_t*)p->memory;

  scalers = (WebPRescaler*)WEBP_ALIGN(
      (const uint8_t*)work + total_size - rescaler_size);
  p->scaler_y = &scalers[0];
  p->scaler_u = &scalers[1];
  p->scaler_v = &scalers[2];
  p->scaler_a = has_alpha ? &scalers[3] : NULL;

  if (!WebPRescalerInit(p->scaler_y, io->mb_w, io->mb_h,
                        buf->y, out_width, out_height, buf->y_stride, 1,
                        work) ||
      !WebPRescalerInit(p->scaler_u, uv_in_width, uv_in_height,
                        buf->u, uv_out_width, uv_out_height, buf->u_stride, 1,
                        work + work_size) ||
      !WebPRescalerInit(p->scaler_v, uv_in_width, uv_in_height,
                        buf->v, uv_out_width, uv_out_height, buf->v_stride, 1,
                        work + work_size + uv_work_size)) {
    return 0;
  }
  p->emit = EmitRescaledYUV;

  if (has_alpha) {
    if (!WebPRescalerInit(p->scaler_a, io->mb_w, io->mb_h,
                          buf->a, out_width, out_height, buf->a_stride, 1,
                          work + work_size + 2 * uv_work_size)) {
      return 0;
    }
    p->emit_alpha = EmitRescaledAlphaYUV;
    WebPInitAlphaProcessing();
  }
  return 1;
}